

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void Cmd_listsublights(FCommandLine *argv,APlayerPawn *who,int key)

{
  FLightNode *local_38;
  FLightNode *node;
  int lights;
  subsector_t *sub;
  int i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  for (sub._0_4_ = 0; (int)(uint)sub < numsubsectors; sub._0_4_ = (uint)sub + 1) {
    node._4_4_ = 0;
    for (local_38 = subsectors[(int)(uint)sub].lighthead; local_38 != (FLightNode *)0x0;
        local_38 = local_38->nextLight) {
      node._4_4_ = node._4_4_ + 1;
    }
    Printf(5,"Subsector %d - %d lights\n",(ulong)(uint)sub,(ulong)node._4_4_);
  }
  return;
}

Assistant:

CCMD(listsublights)
{
	for(int i=0;i<numsubsectors;i++)
	{
		subsector_t *sub = &subsectors[i];
		int lights = 0;

		FLightNode * node = sub->lighthead;
		while (node != NULL)
		{
			lights++;
			node = node->nextLight;
		}

		Printf(PRINT_LOG, "Subsector %d - %d lights\n", i, lights);
	}
}